

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# senone.c
# Opt level: O0

senone_t * senone_init(logmath_t *logmath,char *mixwfile,char *sen2mgau_map,float64 mixwfloor)

{
  int iVar1;
  senone_t *s_00;
  senone_t *s;
  float64 mixwfloor_local;
  char *sen2mgau_map_local;
  char *mixwfile_local;
  logmath_t *logmath_local;
  
  s_00 = (senone_t *)
         __ckd_calloc__(1,0x28,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                        ,0x154);
  s_00->n_sen = 0;
  s_00->sen2mgau = (uint32 *)0x0;
  if (sen2mgau_map == (char *)0x0) {
    __assert_fail("sen2mgau_map",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                  ,0x158,"senone_t *senone_init(logmath_t *, const char *, const char *, float64)");
  }
  iVar1 = strcmp(sen2mgau_map,".semi.");
  if (iVar1 == 0) {
    s_00->n_mgau = 1;
  }
  else {
    iVar1 = strcmp(sen2mgau_map,".cont.");
    if (iVar1 == 0) {
      s_00->n_mgau = 0;
    }
    else {
      senone_mgau_map_read(s_00,sen2mgau_map);
    }
  }
  if (mixwfile == (char *)0x0) {
    __assert_fail("mixwfile",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                  ,0x165,"senone_t *senone_init(logmath_t *, const char *, const char *, float64)");
  }
  senone_mixw_read(logmath,s_00,mixwfile,mixwfloor);
  return s_00;
}

Assistant:

senone_t *senone_init (logmath_t *logmath, const char *mixwfile, const char *sen2mgau_map, float64 mixwfloor)
{
    senone_t *s;
    
    s = (senone_t *) ckd_calloc (1, sizeof(senone_t));
    s->n_sen = 0;	/* As yet unknown */
    s->sen2mgau = NULL;

    assert (sen2mgau_map);

    if (strcmp (sen2mgau_map, ".semi.") == 0) {
	/* Not a file; map all senones to a single parent mgau */
	s->n_mgau = 1;	/* But we don't yet know the #senones */
    } else if (strcmp (sen2mgau_map, ".cont.") == 0) {
	/* Not a file; map each senone to its own distinct parent mgau */
	s->n_mgau = 0;	/* We don't yet know the #senones */
    } else {
	/* Read mapping file */
	senone_mgau_map_read (s, sen2mgau_map);	/* Fills in n_sen */
    }
    
    assert (mixwfile);
    senone_mixw_read (logmath, s, mixwfile, mixwfloor);
    
    return s;
}